

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O2

void __thiscall CMU462::PathTracer::worker_thread(PathTracer *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  WorkItem work;
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  work.tile_x = 0;
  work.tile_y = 0;
  work.tile_w = 0;
  work.tile_h = 0;
  while (this->continueRaytracing == true) {
    bVar1 = WorkQueue<CMU462::WorkItem>::try_get_work(&this->workQueue,&work);
    if (!bVar1) break;
    raytrace_tile(this,work.tile_x,work.tile_y,work.tile_w,work.tile_h);
  }
  LOCK();
  (this->workerDoneCount).super___atomic_base<int>._M_i =
       (this->workerDoneCount).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if ((this->continueRaytracing == false) &&
     (this->numWorkerThreads == (long)(this->workerDoneCount).super___atomic_base<int>._M_i)) {
    std::chrono::_V2::steady_clock::now();
    fwrite("Canceled!\n",10,1,_stdout);
    this->state = READY;
  }
  if ((this->continueRaytracing == true) &&
     (this->numWorkerThreads == (long)(this->workerDoneCount).super___atomic_base<int>._M_i)) {
    lVar3 = std::chrono::_V2::steady_clock::now();
    fprintf(_stdout,"Done! (%.4fs)\n",(double)(lVar3 - lVar2) / 1000000000.0);
    this->state = DONE;
  }
  return;
}

Assistant:

void PathTracer::worker_thread() {

    Timer timer;
    timer.start();

    WorkItem work;
    while (continueRaytracing && workQueue.try_get_work(&work)) {
      raytrace_tile(work.tile_x, work.tile_y, work.tile_w, work.tile_h);
    }

    workerDoneCount++;
    if (!continueRaytracing && workerDoneCount == numWorkerThreads) {
      timer.stop();
      fprintf(stdout, "Canceled!\n");
      state = READY;
    }

    if (continueRaytracing && workerDoneCount == numWorkerThreads) {
      timer.stop();
      fprintf(stdout, "Done! (%.4fs)\n", timer.duration());
      state = DONE;
    }
  }